

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O0

void absl::lts_20250127::debugging_internal::anon_unknown_0::DumpPCAndFrameSizeAndSymbol
               (OutputWriter *writer,void *writer_arg,void *pc,void *symbolize_pc,int framesize,
               char *prefix)

{
  bool bVar1;
  undefined8 in_stack_fffffffffffff7a8;
  undefined4 uVar2;
  char local_848 [8];
  char buf [1024];
  char **local_440;
  char *symbol;
  char tmp [1024];
  char *prefix_local;
  int framesize_local;
  void *symbolize_pc_local;
  void *pc_local;
  void *writer_arg_local;
  OutputWriter *writer_local;
  
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffff7a8 >> 0x20);
  local_440 = (char **)0x821ff4;
  tmp._1016_8_ = prefix;
  bVar1 = Symbolize(symbolize_pc,(char *)&symbol,0x400);
  if (bVar1) {
    local_440 = &symbol;
  }
  if (framesize < 1) {
    snprintf(local_848,0x400,"%s@ %*p  (unknown)  %s\n",tmp._1016_8_,0x12,pc,local_440);
  }
  else {
    snprintf(local_848,0x400,"%s@ %*p  %9d  %s\n",tmp._1016_8_,0x12,pc,CONCAT44(uVar2,framesize),
             local_440);
  }
  (*writer)(local_848,writer_arg);
  return;
}

Assistant:

void DumpPCAndFrameSizeAndSymbol(OutputWriter* writer, void* writer_arg,
                                 void* const pc, void* const symbolize_pc,
                                 int framesize, const char* const prefix) {
  char tmp[1024];
  const char* symbol = "(unknown)";
  if (absl::Symbolize(symbolize_pc, tmp, sizeof(tmp))) {
    symbol = tmp;
  }
  char buf[1024];
  if (framesize <= 0) {
    snprintf(buf, sizeof(buf), "%s@ %*p  (unknown)  %s\n", prefix,
             kPrintfPointerFieldWidth, pc, symbol);
  } else {
    snprintf(buf, sizeof(buf), "%s@ %*p  %9d  %s\n", prefix,
             kPrintfPointerFieldWidth, pc, framesize, symbol);
  }
  writer(buf, writer_arg);
}